

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox.cpp
# Opt level: O1

ostream * CS248::operator<<(ostream *os,BBox *b)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"BBOX(",5);
  poVar1 = operator<<(os,&b->min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = operator<<(poVar1,&b->max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const BBox &b) {
  return os << "BBOX(" << b.min << ", " << b.max << ")";
}